

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O2

double LZ77OptimalRun(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     unsigned_short **path,size_t *pathsize,unsigned_short *length_array,
                     CostModelFun *costmodel,void *costcontext,ZopfliLZ77Store *store,ZopfliHash *h,
                     float *costs)

{
  ushort uVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_short **ppuVar4;
  ulong *puVar5;
  float *pfVar6;
  unsigned_short *puVar7;
  unsigned_short *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  size_t pos;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  uchar *puVar17;
  double dVar18;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar19;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  unsigned_short leng;
  double local_2a0;
  uchar *local_298;
  unsigned_short *local_290;
  unsigned_short dist;
  long local_280;
  unsigned_short **local_278;
  size_t local_270;
  ZopfliBlockState *local_268;
  ulong *local_260;
  float *local_258;
  unsigned_short *local_250;
  ulong local_248;
  double local_240;
  unsigned_short sublen [259];
  
  puVar17 = (uchar *)0x46293e5939a08cea;
  local_278 = path;
  local_268 = s;
  uVar13 = 0;
  for (uVar14 = 3; uVar14 != 0x103; uVar14 = uVar14 + 1) {
    local_298 = puVar17;
    puVar17 = (uchar *)(*costmodel)(uVar14,1,costcontext);
    uVar3 = uVar14;
    if ((double)local_298 <= (double)puVar17) {
      puVar17 = local_298;
      uVar3 = uVar13;
    }
    uVar13 = uVar3;
  }
  dVar18 = 1e+30;
  uVar14 = 0;
  local_298 = in;
  local_270 = instart;
  local_260 = pathsize;
  for (lVar10 = 0; puVar17 = local_298, lVar10 != 0x78; lVar10 = lVar10 + 4) {
    uVar3 = *(uint *)((long)&GetCostModelMinCost_dsymbols + lVar10);
    local_2a0 = dVar18;
    dVar18 = (*costmodel)(3,uVar3,costcontext);
    if (local_2a0 <= dVar18) {
      dVar18 = local_2a0;
      uVar3 = uVar14;
    }
    uVar14 = uVar3;
  }
  local_240 = (*costmodel)(uVar13,uVar14,costcontext);
  pos = local_270;
  local_280 = inend - local_270;
  if (local_280 != 0) {
    uVar16 = 1;
    sVar15 = 0;
    if (0x7fff < local_270) {
      sVar15 = local_270 - 0x8000;
    }
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(puVar17,sVar15,inend,h);
    for (; sVar15 < pos; sVar15 = sVar15 + 1) {
      ZopfliUpdateHash(puVar17,sVar15,inend,h);
    }
    for (; uVar16 < local_280 + 1U; uVar16 = uVar16 + 1) {
      costs[uVar16] = 1e+30;
    }
    *costs = 0.0;
    *length_array = 0;
    local_248 = pos + 0x103;
    local_250 = length_array + (0x102 - pos);
    local_258 = costs + -pos;
    sVar15 = pos;
    local_290 = (unsigned_short *)inend;
    while (puVar7 = local_290, inend = (size_t)local_290, sVar15 < local_290) {
      lVar10 = sVar15 - pos;
      ZopfliUpdateHash(puVar17,sVar15,(size_t)local_290,h);
      if ((sVar15 + 0x205 < puVar7) && (local_248 < sVar15)) {
        if ((0x204 < h->same[(uint)sVar15 & 0x7fff]) &&
           (0x102 < h->same[(uint)sVar15 + 0x7efe & 0x7fff])) {
          local_2a0 = (*costmodel)(0x102,1,costcontext);
          puVar7 = local_250;
          pfVar6 = local_258;
          for (lVar11 = 0; lVar11 != 0x102; lVar11 = lVar11 + 1) {
            pfVar6[sVar15 + lVar11 + 0x102] = (float)((double)pfVar6[sVar15 + lVar11] + local_2a0);
            puVar7[sVar15 + lVar11] = 0x102;
            ZopfliUpdateHash(puVar17,lVar11 + 1 + sVar15,(size_t)local_290,h);
          }
          lVar10 = lVar10 + 0x102;
          sVar15 = sVar15 + 0x102;
          puVar7 = local_290;
        }
      }
      ZopfliFindLongestMatch(local_268,h,puVar17,sVar15,(size_t)puVar7,0x102,sublen,&dist,&leng);
      uVar16 = sVar15 + 1;
      if (puVar7 < uVar16) {
        dVar18 = (double)costs[lVar10];
      }
      else {
        dVar19 = (*costmodel)((uint)puVar17[sVar15],0,costcontext);
        dVar18 = (double)costs[lVar10];
        if (dVar19 + dVar18 < (double)costs[lVar10 + 1]) {
          costs[lVar10 + 1] = (float)(dVar19 + dVar18);
          length_array[lVar10 + 1] = 1;
        }
      }
      uVar9 = (long)puVar7 - sVar15;
      if ((ulong)leng < (long)puVar7 - sVar15) {
        uVar9 = (ulong)leng;
      }
      dVar18 = dVar18 + local_240;
      local_2a0 = dVar18;
      for (uVar12 = 3; pos = local_270, puVar17 = local_298, sVar15 = uVar16, uVar12 <= uVar9;
          uVar12 = uVar12 + 1) {
        if (dVar18 < (double)costs[lVar10 + uVar12]) {
          dVar19 = (*costmodel)((uint)uVar12,(uint)sublen[uVar12],costcontext);
          dVar18 = local_2a0;
          if ((double)costs[lVar10] + dVar19 < (double)costs[lVar10 + uVar12]) {
            costs[lVar10 + uVar12] = (float)((double)costs[lVar10] + dVar19);
            length_array[lVar10 + uVar12] = (unsigned_short)uVar12;
          }
        }
      }
    }
  }
  ppuVar4 = local_278;
  free(*local_278);
  puVar5 = local_260;
  *ppuVar4 = (unsigned_short *)0x0;
  *local_260 = 0;
  dVar18 = extraout_XMM0_Qa;
  if (local_280 == 0) {
    uVar16 = 0;
    puVar7 = (unsigned_short *)0x0;
  }
  else {
    puVar7 = (unsigned_short *)0x0;
    uVar16 = 0;
    lVar10 = local_280;
    do {
      uVar9 = uVar16;
      if ((uVar16 & uVar16 - 1) == 0) {
        if (uVar16 == 0) {
          puVar7 = (unsigned_short *)malloc(2);
          uVar9 = 0;
          dVar18 = extraout_XMM0_Qa_01;
        }
        else {
          puVar7 = (unsigned_short *)realloc(puVar7,uVar16 << 2);
          uVar9 = *puVar5;
          dVar18 = extraout_XMM0_Qa_00;
        }
        *local_278 = puVar7;
      }
      uVar1 = length_array[lVar10];
      puVar7[uVar9] = uVar1;
      uVar16 = uVar9 + 1;
      *puVar5 = uVar16;
      lVar10 = lVar10 - (ulong)uVar1;
    } while (lVar10 != 0);
    puVar8 = puVar7 + uVar9;
    for (uVar9 = 0; uVar16 >> 1 != uVar9; uVar9 = uVar9 + 1) {
      uVar2 = puVar7[uVar9];
      puVar7[uVar9] = *puVar8;
      *puVar8 = uVar2;
      puVar8 = puVar8 + -1;
    }
  }
  if (inend != pos) {
    sVar15 = 0;
    if (0x7fff < pos) {
      sVar15 = pos - 0x8000;
    }
    local_290 = puVar7;
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(puVar17,sVar15,inend,h);
    dVar18 = extraout_XMM0_Qa_02;
    for (; sVar15 < pos; sVar15 = sVar15 + 1) {
      ZopfliUpdateHash(puVar17,sVar15,inend,h);
      dVar18 = extraout_XMM0_Qa_03;
    }
    local_2a0 = 0.0;
    while (local_2a0 != (double)uVar16) {
      uVar1 = local_290[(long)local_2a0];
      uVar9 = (ulong)uVar1;
      ZopfliUpdateHash(puVar17,pos,inend,h);
      if (uVar9 < 3) {
        ZopfliStoreLitLenDist((ushort)puVar17[pos],0,pos,store);
        uVar9 = 1;
        dVar18 = extraout_XMM0_Qa_05;
      }
      else {
        ZopfliFindLongestMatch
                  (local_268,h,puVar17,pos,inend,uVar9,(unsigned_short *)0x0,&leng,sublen);
        ZopfliVerifyLenDist(puVar17,inend,pos,leng,uVar1);
        ZopfliStoreLitLenDist(uVar1,leng,pos,store);
        dVar18 = extraout_XMM0_Qa_04;
      }
      dVar19 = local_2a0;
      for (uVar12 = 1; uVar12 < uVar9; uVar12 = uVar12 + 1) {
        ZopfliUpdateHash(local_298,uVar12 + pos,inend,h);
        dVar18 = extraout_XMM0_Qa_06;
      }
      pos = pos + uVar9;
      puVar17 = local_298;
      local_2a0 = (double)((long)dVar19 + 1);
    }
  }
  return dVar18;
}

Assistant:

static double LZ77OptimalRun(ZopfliBlockState* s,
    const unsigned char* in, size_t instart, size_t inend,
    unsigned short** path, size_t* pathsize,
    unsigned short* length_array, CostModelFun* costmodel,
    void* costcontext, ZopfliLZ77Store* store,
    ZopfliHash* h, float* costs) {
  double cost = GetBestLengths(s, in, instart, inend, costmodel,
                costcontext, length_array, h, costs);
  free(*path);
  *path = 0;
  *pathsize = 0;
  TraceBackwards(inend - instart, length_array, path, pathsize);
  FollowPath(s, in, instart, inend, *path, *pathsize, store, h);
  assert(cost < ZOPFLI_LARGE_FLOAT);
  return cost;
}